

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

int __thiscall raspicam::_private::Private_Impl_Still::startCapture(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  uint uVar2;
  ostream *poVar3;
  MMAL_BUFFER_HEADER_T *buffer_00;
  long in_RDI;
  MMAL_BUFFER_HEADER_T *buffer;
  int b;
  int num;
  int local_18;
  int local_4;
  
  commitParameters(_b);
  if (*(int *)(*(long *)(in_RDI + 0x30) + 0x18) == 0) {
    MVar1 = mmal_port_enable(*(MMAL_PORT_T **)(in_RDI + 0x30),buffer_callback);
    if (MVar1 == MMAL_SUCCESS) {
      uVar2 = mmal_queue_length((MMAL_QUEUE_T *)**(undefined8 **)(in_RDI + 0x18));
      for (local_18 = 0; local_18 < (int)uVar2; local_18 = local_18 + 1) {
        buffer_00 = mmal_queue_get((MMAL_QUEUE_T *)**(undefined8 **)(in_RDI + 0x18));
        if (buffer_00 == (MMAL_BUFFER_HEADER_T *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cout,*(char **)(in_RDI + 0x78));
          poVar3 = std::operator<<(poVar3,": Could not get buffer (#");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
          std::operator<<(poVar3,") from pool queue.\n");
        }
        MVar1 = mmal_port_send_buffer(*(MMAL_PORT_T **)(in_RDI + 0x30),buffer_00);
        if (MVar1 != MMAL_SUCCESS) {
          poVar3 = std::operator<<((ostream *)&std::cout,*(char **)(in_RDI + 0x78));
          poVar3 = std::operator<<(poVar3,": Could not send a buffer (#");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
          std::operator<<(poVar3,") to encoder output port.\n");
        }
      }
      MVar1 = mmal_port_parameter_set_boolean(*(MMAL_PORT_T **)(in_RDI + 0x20),0x10011,1);
      if (MVar1 == MMAL_SUCCESS) {
        local_4 = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,*(char **)(in_RDI + 0x78));
        std::operator<<(poVar3,": Failed to start capture.\n");
        local_4 = -1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,*(char **)(in_RDI + 0x78));
      std::operator<<(poVar3,": Could not enable encoder output port.\n");
      local_4 = -1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,*(char **)(in_RDI + 0x78));
    std::operator<<(poVar3,
                    ": Could not enable encoder output port. Try waiting longer before attempting to take another picture.\n"
                   );
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Private_Impl_Still::startCapture() {
            // If the parameters were changed and this function wasn't called, it will be called here
            // However if the parameters weren't changed, the function won't do anything - it will return right away
            commitParameters();

            if ( encoder_output_port->is_enabled ) {
                cout << API_NAME << ": Could not enable encoder output port. Try waiting longer before attempting to take another picture.\n";
                return -1;
            }
            if ( mmal_port_enable ( encoder_output_port, buffer_callback ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": Could not enable encoder output port.\n";
                return -1;
            }
            int num = mmal_queue_length ( encoder_pool->queue );
            for ( int b = 0; b < num; b++ ) {
                MMAL_BUFFER_HEADER_T *buffer = mmal_queue_get ( encoder_pool->queue );

                if ( !buffer )
                    cout << API_NAME << ": Could not get buffer (#" << b << ") from pool queue.\n";

                if ( mmal_port_send_buffer ( encoder_output_port, buffer ) != MMAL_SUCCESS )
                    cout << API_NAME << ": Could not send a buffer (#" << b << ") to encoder output port.\n";
            }
            if ( mmal_port_parameter_set_boolean ( camera_still_port, MMAL_PARAMETER_CAPTURE, 1 ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": Failed to start capture.\n";
                return -1;
            }
            return 0;
        }